

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderCancelReplaceRequest.h
# Opt level: O0

void __thiscall
FIX50::OrderCancelReplaceRequest::OrderCancelReplaceRequest
          (OrderCancelReplaceRequest *this,OrigClOrdID *aOrigClOrdID,ClOrdID *aClOrdID,Side *aSide,
          TransactTime *aTransactTime,OrdType *aOrdType)

{
  MsgType local_90;
  OrdType *local_38;
  OrdType *aOrdType_local;
  TransactTime *aTransactTime_local;
  Side *aSide_local;
  ClOrdID *aClOrdID_local;
  OrigClOrdID *aOrigClOrdID_local;
  OrderCancelReplaceRequest *this_local;
  
  local_38 = aOrdType;
  aOrdType_local = (OrdType *)aTransactTime;
  aTransactTime_local = (TransactTime *)aSide;
  aSide_local = (Side *)aClOrdID;
  aClOrdID_local = (ClOrdID *)aOrigClOrdID;
  aOrigClOrdID_local = (OrigClOrdID *)this;
  MsgType();
  FIX50::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__OrderCancelReplaceRequest_0018a498;
  set(this,(OrigClOrdID *)aClOrdID_local);
  set(this,(ClOrdID *)aSide_local);
  set(this,(Side *)aTransactTime_local);
  set(this,(TransactTime *)aOrdType_local);
  set(this,local_38);
  return;
}

Assistant:

OrderCancelReplaceRequest(
      const FIX::OrigClOrdID& aOrigClOrdID,
      const FIX::ClOrdID& aClOrdID,
      const FIX::Side& aSide,
      const FIX::TransactTime& aTransactTime,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aOrigClOrdID);
      set(aClOrdID);
      set(aSide);
      set(aTransactTime);
      set(aOrdType);
    }